

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O3

Host * __thiscall Jupiter::HTTP::Server::Data::find_host(Data *this,string_view name)

{
  pointer puVar1;
  Host *pHVar2;
  int iVar3;
  uint uVar4;
  size_t __n;
  unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_> *host;
  size_t sVar5;
  pointer puVar6;
  size_type __rlen;
  
  __n = name._M_len;
  if (__n == 0) {
    uVar4 = 0;
  }
  else {
    sVar5 = 0;
    uVar4 = 0;
    do {
      iVar3 = jessilib::fold((int)name._M_str[sVar5]);
      uVar4 = uVar4 + iVar3;
      sVar5 = sVar5 + 1;
    } while (__n != sVar5);
  }
  puVar6 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar6 == puVar1) {
      return (Host *)0x0;
    }
    pHVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
    if ((uVar4 == (pHVar2->super_Directory).name_checksum) &&
       (*(size_type *)((long)&(pHVar2->super_Directory).name + 8) == __n)) {
      if (__n == 0) {
        return pHVar2;
      }
      iVar3 = bcmp(name._M_str,(pHVar2->super_Directory).name._M_dataplus._M_p,__n);
      if (iVar3 == 0) {
        return pHVar2;
      }
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

Jupiter::HTTP::Server::Host *Jupiter::HTTP::Server::Data::find_host(std::string_view name) {
	unsigned int name_checksum = calc_checksumi(name);
	for (const auto& host : m_hosts) {
		if (name_checksum == host->name_checksum && host->name == name) {
			return host.get();
		}
	}

	return nullptr;
}